

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O2

void __thiscall chrono::ChParticleCloud::ClampSpeed(ChParticleCloud *this)

{
  pointer ppCVar1;
  ChAparticle *pCVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double local_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  
  if (this->do_limit_speed == true) {
    uVar3 = 0;
    while( true ) {
      ppCVar1 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (ulong)uVar3;
      if ((ulong)((long)(this->particles).
                        super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3) <= uVar4)
      break;
      dVar5 = ChQuaternion<double>::Length
                        ((ChQuaternion<double> *)
                         ((long)&(ppCVar1[uVar4]->super_ChParticleBase).super_ChFrameMoving<double>.
                                 coord_dt + 0x18));
      dVar6 = (double)this->max_wvel;
      if (dVar6 < dVar5 + dVar5) {
        pCVar2 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
        dStack_30 = 1.0 / (dVar5 + dVar5);
        local_48 = dStack_30 *
                   dVar6 * ((ChQuaternion<double> *)
                           ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                   coord_dt + 0x18))->m_data[0];
        dStack_40 = dStack_30 *
                    dVar6 * *(double *)
                             ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                     coord_dt + 0x20);
        dStack_38 = dStack_30 *
                    dVar6 * *(double *)
                             ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                     coord_dt + 0x28);
        dStack_30 = dStack_30 *
                    dVar6 * *(double *)
                             ((long)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                     coord_dt + 0x30);
        (**(code **)(*(long *)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x40))(pCVar2,&local_48);
      }
      dVar5 = ChVector<double>::Length
                        (&((this->particles).
                           super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4]->super_ChParticleBase).
                          super_ChFrameMoving<double>.coord_dt.pos);
      dVar6 = (double)this->max_speed;
      if (dVar6 < dVar5) {
        pCVar2 = (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
        dVar5 = 1.0 / dVar5;
        dStack_38 = dVar5 * dVar6 * *(double *)
                                     ((long)&(pCVar2->super_ChParticleBase).
                                             super_ChFrameMoving<double>.coord_dt + 0x10);
        local_48 = dVar5 * dVar6 * (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                                   coord_dt.pos.m_data[0];
        dStack_40 = dVar5 * dVar6 * *(double *)
                                     ((long)&(pCVar2->super_ChParticleBase).
                                             super_ChFrameMoving<double>.coord_dt + 8);
        (**(code **)(*(long *)&(pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.
                               super_ChFrame<double> + 0x38))(pCVar2,&local_48);
      }
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

void ChParticleCloud::ClampSpeed() {
    if (GetLimitSpeed()) {
        for (unsigned int j = 0; j < particles.size(); j++) {
            double w = 2.0 * particles[j]->GetRot_dt().Length();
            if (w > max_wvel)
                particles[j]->SetRot_dt(particles[j]->GetRot_dt() * max_wvel / w);

            double v = particles[j]->GetPos_dt().Length();
            if (v > max_speed)
                particles[j]->SetPos_dt(particles[j]->GetPos_dt() * max_speed / v);
        }
    }
}